

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O1

int main(void)

{
  uint8_t *puVar1;
  undefined4 uVar2;
  tommy_hashlin_node **pptVar3;
  _Bool _Var4;
  _Bool _Var5;
  uint32_t i_1;
  int iVar6;
  rtr_socket *socket;
  rtr_socket *__ptr;
  undefined8 *__ptr_00;
  long lVar7;
  spki_record *psVar8;
  rtr_socket *prVar9;
  spki_record *psVar10;
  spki_record *record_00;
  spki_record *record_01;
  int i_3;
  spki_table *spki_table;
  spki_record *record;
  int i;
  uint uVar11;
  int j;
  long lVar12;
  int j_1;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint result_len;
  spki_table table;
  uint8_t ski [20];
  spki_record *result;
  uint in_stack_ffffffffffceebd0;
  tommy_hashlin_node **in_stack_ffffffffffceebd8;
  spki_table local_4028 [43];
  spki_record *local_1a8 [46];
  undefined8 local_38;
  
  local_38 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  socket = (rtr_socket *)malloc(0x80);
  __ptr = (rtr_socket *)malloc(0x80);
  __ptr_00 = (undefined8 *)malloc(0x80);
  __ptr_00[2] = 0;
  __ptr_00[3] = 0;
  *__ptr_00 = 0;
  __ptr_00[1] = 0;
  __ptr_00[4] = 0;
  __ptr_00[5] = 0;
  __ptr_00[6] = 0;
  __ptr_00[7] = 0;
  __ptr_00[8] = 0;
  __ptr_00[9] = 0;
  __ptr_00[10] = 0;
  __ptr_00[0xb] = 0;
  __ptr_00[0xc] = 0;
  __ptr_00[0xd] = 0;
  __ptr_00[0xe] = 0;
  __ptr_00[0xf] = 0;
  *(undefined4 *)((long)__ptr_00 + 0x14) = 1;
  lVar7 = 0;
  do {
    *(int *)((long)__ptr_00 + lVar7 * 4) = (int)lVar7;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  lVar7 = 0;
  do {
    *(int *)((long)__ptr_00 + lVar7 * 4 + 0x18) = (int)lVar7;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x16);
  __ptr_00[0xf] = 0;
  uVar11 = 0;
  spki_table_init((spki_table *)&stack0xffffffffffceebd8,(spki_update_fp)0x0);
  local_4028[0].hashtable.bucket[2]._0_4_ = *(undefined4 *)(__ptr_00 + 2);
  local_4028[0].hashtable.bucket[0] = (tommy_hashlin_node **)*__ptr_00;
  local_4028[0].hashtable.bucket[1] = (tommy_hashlin_node **)__ptr_00[1];
  free(__ptr_00);
  do {
    psVar8 = (spki_record *)malloc(0x80);
    *(undefined1 (*) [16])(psVar8->ski + 0x10) = (undefined1  [16])0x0;
    psVar8->ski[0] = '\0';
    psVar8->ski[1] = '\0';
    psVar8->ski[2] = '\0';
    psVar8->ski[3] = '\0';
    psVar8->ski[4] = '\0';
    psVar8->ski[5] = '\0';
    psVar8->ski[6] = '\0';
    psVar8->ski[7] = '\0';
    psVar8->ski[8] = '\0';
    psVar8->ski[9] = '\0';
    psVar8->ski[10] = '\0';
    psVar8->ski[0xb] = '\0';
    psVar8->ski[0xc] = '\0';
    psVar8->ski[0xd] = '\0';
    psVar8->ski[0xe] = '\0';
    psVar8->ski[0xf] = '\0';
    psVar8->spki[8] = '\0';
    psVar8->spki[9] = '\0';
    psVar8->spki[10] = '\0';
    psVar8->spki[0xb] = '\0';
    psVar8->spki[0xc] = '\0';
    psVar8->spki[0xd] = '\0';
    psVar8->spki[0xe] = '\0';
    psVar8->spki[0xf] = '\0';
    psVar8->spki[0x10] = '\0';
    psVar8->spki[0x11] = '\0';
    psVar8->spki[0x12] = '\0';
    psVar8->spki[0x13] = '\0';
    psVar8->spki[0x14] = '\0';
    psVar8->spki[0x15] = '\0';
    psVar8->spki[0x16] = '\0';
    psVar8->spki[0x17] = '\0';
    psVar8->spki[0x18] = '\0';
    psVar8->spki[0x19] = '\0';
    psVar8->spki[0x1a] = '\0';
    psVar8->spki[0x1b] = '\0';
    psVar8->spki[0x1c] = '\0';
    psVar8->spki[0x1d] = '\0';
    psVar8->spki[0x1e] = '\0';
    psVar8->spki[0x1f] = '\0';
    psVar8->spki[0x20] = '\0';
    psVar8->spki[0x21] = '\0';
    psVar8->spki[0x22] = '\0';
    psVar8->spki[0x23] = '\0';
    psVar8->spki[0x24] = '\0';
    psVar8->spki[0x25] = '\0';
    psVar8->spki[0x26] = '\0';
    psVar8->spki[0x27] = '\0';
    psVar8->spki[0x28] = '\0';
    psVar8->spki[0x29] = '\0';
    psVar8->spki[0x2a] = '\0';
    psVar8->spki[0x2b] = '\0';
    psVar8->spki[0x2c] = '\0';
    psVar8->spki[0x2d] = '\0';
    psVar8->spki[0x2e] = '\0';
    psVar8->spki[0x2f] = '\0';
    psVar8->spki[0x30] = '\0';
    psVar8->spki[0x31] = '\0';
    psVar8->spki[0x32] = '\0';
    psVar8->spki[0x33] = '\0';
    psVar8->spki[0x34] = '\0';
    psVar8->spki[0x35] = '\0';
    psVar8->spki[0x36] = '\0';
    psVar8->spki[0x37] = '\0';
    psVar8->spki[0x38] = '\0';
    psVar8->spki[0x39] = '\0';
    psVar8->spki[0x3a] = '\0';
    psVar8->spki[0x3b] = '\0';
    psVar8->spki[0x3c] = '\0';
    psVar8->spki[0x3d] = '\0';
    psVar8->spki[0x3e] = '\0';
    psVar8->spki[0x3f] = '\0';
    psVar8->spki[0x40] = '\0';
    psVar8->spki[0x41] = '\0';
    psVar8->spki[0x42] = '\0';
    psVar8->spki[0x43] = '\0';
    psVar8->spki[0x44] = '\0';
    psVar8->spki[0x45] = '\0';
    psVar8->spki[0x46] = '\0';
    psVar8->spki[0x47] = '\0';
    psVar8->spki[0x48] = '\0';
    psVar8->spki[0x49] = '\0';
    psVar8->spki[0x4a] = '\0';
    psVar8->spki[0x4b] = '\0';
    psVar8->spki[0x4c] = '\0';
    psVar8->spki[0x4d] = '\0';
    psVar8->spki[0x4e] = '\0';
    psVar8->spki[0x4f] = '\0';
    psVar8->spki[0x50] = '\0';
    psVar8->spki[0x51] = '\0';
    psVar8->spki[0x52] = '\0';
    psVar8->spki[0x53] = '\0';
    psVar8->spki[0x54] = '\0';
    psVar8->spki[0x55] = '\0';
    psVar8->spki[0x56] = '\0';
    psVar8->spki[0x57] = '\0';
    *(undefined1 (*) [16])(psVar8->spki + 0x58) = (undefined1  [16])0x0;
    psVar8->asn = 1;
    lVar7 = 0;
    if ((uVar11 & 1) == 0) {
      do {
        *(int *)(psVar8->ski + lVar7 * 4) = (int)lVar7;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      lVar7 = 0;
      do {
        *(uint *)(psVar8->spki + lVar7 * 4) = (int)lVar7 + uVar11;
        lVar7 = lVar7 + 1;
        prVar9 = __ptr;
      } while (lVar7 != 0x16);
    }
    else {
      do {
        *(int *)(psVar8->ski + lVar7 * 4) = (int)lVar7;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      lVar7 = 0;
      do {
        *(uint *)(psVar8->spki + lVar7 * 4) = (int)lVar7 + uVar11;
        lVar7 = lVar7 + 1;
        prVar9 = socket;
      } while (lVar7 != 0x16);
    }
    psVar8->socket = prVar9;
    _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar8);
    free(psVar8);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0xff);
  spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,1,(uint8_t *)local_4028,local_1a8,
                     (uint *)&stack0xffffffffffceebd0);
  if ((ulong)in_stack_ffffffffffceebd0 != 0) {
    if (local_1a8[0]->asn != 1) {
      __assert_fail("result->asn == asn",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x93,"void test_ht_1(void)");
    }
    lVar7 = 0;
    do {
      puVar1 = local_1a8[0]->ski + lVar7;
      uVar2 = *(undefined4 *)(local_1a8[0]->ski + lVar7 + 0x10);
      auVar14[0] = -(*puVar1 == (uint8_t)local_4028[0].hashtable.bucket[0]);
      auVar14[1] = -(puVar1[1] == local_4028[0].hashtable.bucket[0]._1_1_);
      auVar14[2] = -(puVar1[2] == local_4028[0].hashtable.bucket[0]._2_1_);
      auVar14[3] = -(puVar1[3] == local_4028[0].hashtable.bucket[0]._3_1_);
      auVar14[4] = -(puVar1[4] == local_4028[0].hashtable.bucket[0]._4_1_);
      auVar14[5] = -(puVar1[5] == local_4028[0].hashtable.bucket[0]._5_1_);
      auVar14[6] = -(puVar1[6] == local_4028[0].hashtable.bucket[0]._6_1_);
      auVar14[7] = -(puVar1[7] == local_4028[0].hashtable.bucket[0]._7_1_);
      auVar14[8] = -(puVar1[8] == (uint8_t)local_4028[0].hashtable.bucket[1]);
      auVar14[9] = -(puVar1[9] == local_4028[0].hashtable.bucket[1]._1_1_);
      auVar14[10] = -(puVar1[10] == local_4028[0].hashtable.bucket[1]._2_1_);
      auVar14[0xb] = -(puVar1[0xb] == local_4028[0].hashtable.bucket[1]._3_1_);
      auVar14[0xc] = -(puVar1[0xc] == local_4028[0].hashtable.bucket[1]._4_1_);
      auVar14[0xd] = -(puVar1[0xd] == local_4028[0].hashtable.bucket[1]._5_1_);
      auVar14[0xe] = -(puVar1[0xe] == local_4028[0].hashtable.bucket[1]._6_1_);
      auVar14[0xf] = -(puVar1[0xf] == local_4028[0].hashtable.bucket[1]._7_1_);
      auVar15[0] = -((char)uVar2 == (char)local_4028[0].hashtable.bucket[2]._0_4_);
      auVar15[1] = -((char)((uint)uVar2 >> 8) ==
                    (char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 8));
      auVar15[2] = -((char)((uint)uVar2 >> 0x10) ==
                    (char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x10));
      auVar15[3] = -((char)((uint)uVar2 >> 0x18) ==
                    (char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x18));
      auVar15[4] = 0xff;
      auVar15[5] = 0xff;
      auVar15[6] = 0xff;
      auVar15[7] = 0xff;
      auVar15[8] = 0xff;
      auVar15[9] = 0xff;
      auVar15[10] = 0xff;
      auVar15[0xb] = 0xff;
      auVar15[0xc] = 0xff;
      auVar15[0xd] = 0xff;
      auVar15[0xe] = 0xff;
      auVar15[0xf] = 0xff;
      auVar14 = auVar14 & auVar15;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) {
        __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x94,"void test_ht_1(void)");
      }
      lVar7 = lVar7 + 0x80;
    } while ((ulong)in_stack_ffffffffffceebd0 << 7 != lVar7);
    if (in_stack_ffffffffffceebd0 == 0xff) {
      free(local_1a8[0]);
      spki_table_src_remove((spki_table *)&stack0xffffffffffceebd8,socket);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,1,(uint8_t *)local_4028,local_1a8,
                         (uint *)&stack0xffffffffffceebd0);
      lVar7 = 0xff;
      psVar8 = local_1a8[0];
      do {
        if (psVar8->asn != 1) {
          __assert_fail("result[i].asn == asn",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0x9f,"void test_ht_1(void)");
        }
        uVar2 = *(undefined4 *)(psVar8->ski + 0x10);
        auVar13[0] = -(psVar8->ski[0] == (uint8_t)local_4028[0].hashtable.bucket[0]);
        auVar13[1] = -(psVar8->ski[1] == local_4028[0].hashtable.bucket[0]._1_1_);
        auVar13[2] = -(psVar8->ski[2] == local_4028[0].hashtable.bucket[0]._2_1_);
        auVar13[3] = -(psVar8->ski[3] == local_4028[0].hashtable.bucket[0]._3_1_);
        auVar13[4] = -(psVar8->ski[4] == local_4028[0].hashtable.bucket[0]._4_1_);
        auVar13[5] = -(psVar8->ski[5] == local_4028[0].hashtable.bucket[0]._5_1_);
        auVar13[6] = -(psVar8->ski[6] == local_4028[0].hashtable.bucket[0]._6_1_);
        auVar13[7] = -(psVar8->ski[7] == local_4028[0].hashtable.bucket[0]._7_1_);
        auVar13[8] = -(psVar8->ski[8] == (uint8_t)local_4028[0].hashtable.bucket[1]);
        auVar13[9] = -(psVar8->ski[9] == local_4028[0].hashtable.bucket[1]._1_1_);
        auVar13[10] = -(psVar8->ski[10] == local_4028[0].hashtable.bucket[1]._2_1_);
        auVar13[0xb] = -(psVar8->ski[0xb] == local_4028[0].hashtable.bucket[1]._3_1_);
        auVar13[0xc] = -(psVar8->ski[0xc] == local_4028[0].hashtable.bucket[1]._4_1_);
        auVar13[0xd] = -(psVar8->ski[0xd] == local_4028[0].hashtable.bucket[1]._5_1_);
        auVar13[0xe] = -(psVar8->ski[0xe] == local_4028[0].hashtable.bucket[1]._6_1_);
        auVar13[0xf] = -(psVar8->ski[0xf] == local_4028[0].hashtable.bucket[1]._7_1_);
        auVar16[0] = -((char)local_4028[0].hashtable.bucket[2]._0_4_ == (char)uVar2);
        auVar16[1] = -((char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 8) ==
                      (char)((uint)uVar2 >> 8));
        auVar16[2] = -((char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x10) ==
                      (char)((uint)uVar2 >> 0x10));
        auVar16[3] = -((char)((uint)local_4028[0].hashtable.bucket[2]._0_4_ >> 0x18) ==
                      (char)((uint)uVar2 >> 0x18));
        auVar16[4] = 0xff;
        auVar16[5] = 0xff;
        auVar16[6] = 0xff;
        auVar16[7] = 0xff;
        auVar16[8] = 0xff;
        auVar16[9] = 0xff;
        auVar16[10] = 0xff;
        auVar16[0xb] = 0xff;
        auVar16[0xc] = 0xff;
        auVar16[0xd] = 0xff;
        auVar16[0xe] = 0xff;
        auVar16[0xf] = 0xff;
        auVar13 = auVar13 & auVar16;
        if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
          __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0xa0,"void test_ht_1(void)");
        }
        if (psVar8->socket != __ptr) {
          __assert_fail("result[i].socket == socket_two",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0xa1,"void test_ht_1(void)");
        }
        psVar8 = psVar8 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      spki_table_free((spki_table *)&stack0xffffffffffceebd8);
      free(local_1a8[0]);
      free(socket);
      free(__ptr);
      printf("%s() complete\n","test_ht_1");
      psVar8 = create_record(10,0x14,0x1e,(rtr_socket *)0x0);
      psVar10 = create_record(10,0x14,0x28,(rtr_socket *)0x0);
      spki_table_init((spki_table *)&stack0xffffffffffceebd8,(spki_update_fp)0x0);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar8);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar10);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar8->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      pptVar3 = local_4028[0].hashtable.bucket[0];
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xbe,"void test_ht_2(void)");
      }
      _Var4 = spki_records_are_equal((spki_record *)local_4028[0].hashtable.bucket[0],psVar8);
      _Var5 = spki_records_are_equal((spki_record *)pptVar3,psVar10);
      if (_Var4 == _Var5) {
        __assert_fail("spki_records_are_equal(&result[0], record1) != spki_records_are_equal(&result[0], record2)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xc1,"void test_ht_2(void)");
      }
      _Var4 = spki_records_are_equal((spki_record *)((long)pptVar3 + 0x80),psVar8);
      _Var5 = spki_records_are_equal((spki_record *)((long)pptVar3 + 0x80),psVar10);
      if (_Var4 == _Var5) {
        __assert_fail("spki_records_are_equal(&result[1], record1) != spki_records_are_equal(&result[1], record2)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xc2,"void test_ht_2(void)");
      }
      free(pptVar3);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar8);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar8->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      pptVar3 = local_4028[0].hashtable.bucket[0];
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,200,"void test_ht_2(void)");
      }
      _Var4 = spki_records_are_equal((spki_record *)local_4028[0].hashtable.bucket[0],psVar10);
      if (!_Var4) {
        __assert_fail("spki_records_are_equal(&result[0], record2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xc9,"void test_ht_2(void)");
      }
      free(pptVar3);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar10);
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar8->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      if ((int)local_1a8[0] != 0) {
        __assert_fail("result_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xcf,"void test_ht_2(void)");
      }
      if ((spki_record *)local_4028[0].hashtable.bucket[0] != (spki_record *)0x0) {
        __assert_fail("!result",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xd0,"void test_ht_2(void)");
      }
      spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,10,psVar10->ski,
                         (spki_record **)local_4028,(uint *)local_1a8);
      if ((int)local_1a8[0] != 0) {
        __assert_fail("result_len == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xd2,"void test_ht_2(void)");
      }
      if ((spki_record *)local_4028[0].hashtable.bucket[0] != (spki_record *)0x0) {
        __assert_fail("!result",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xd3,"void test_ht_2(void)");
      }
      free(psVar8);
      free(psVar10);
      spki_table_free((spki_table *)&stack0xffffffffffceebd8);
      printf("%s() complete\n","test_ht_2");
      psVar8 = create_record(10,10,10,(rtr_socket *)0x0);
      psVar10 = create_record(10,10,0xb,(rtr_socket *)0x0);
      record_00 = create_record(10,0xb,10,(rtr_socket *)0x0);
      record_01 = create_record(0xb,10,10,(rtr_socket *)0x0);
      spki_table_init((spki_table *)&stack0xffffffffffceebd8,(spki_update_fp)0x0);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar8);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar10);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,record_00);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,record_01);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar8);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar10->asn,psVar10->ski,
                                 (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xf8,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xf9,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_00->asn,
                                 record_00->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xfc,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0xfd,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_01->asn,
                                 record_01->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x100,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x101,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar8);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,psVar10);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar8->asn,psVar8->ski,
                                 (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x109,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x10a,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_00->asn,
                                 record_00->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x10d,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x10e,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_01->asn,
                                 record_01->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x111,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x112,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,psVar10);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,record_00);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar8->asn,psVar8->ski,
                                 (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11a,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11b,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar10->asn,psVar10->ski,
                                 (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11e,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x11f,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_01->asn,
                                 record_01->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x122,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x123,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      _spki_table_add_assert((spki_table *)&stack0xffffffffffceebd8,record_00);
      _spki_table_remove_assert((spki_table *)&stack0xffffffffffceebd8,record_01);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar8->asn,psVar8->ski,
                                 (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,299,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,300,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,psVar10->asn,psVar10->ski,
                                 (spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x12f,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 2) {
        __assert_fail("result_len == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x130,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      iVar6 = spki_table_get_all((spki_table *)&stack0xffffffffffceebd8,record_00->asn,
                                 record_00->ski,(spki_record **)local_4028,(uint *)local_1a8);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x133,"void test_ht_3(void)");
      }
      if ((int)local_1a8[0] != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x134,"void test_ht_3(void)");
      }
      free(local_4028[0].hashtable.bucket[0]);
      spki_table = (spki_table *)&stack0xffffffffffceebd8;
      spki_table_free(spki_table);
      free(psVar8);
      free(psVar10);
      free(record_00);
      free(record_01);
      lVar7 = 0;
      printf("%s complete\n");
      spki_table_init(local_4028,(spki_update_fp)0x0);
      do {
        lVar12 = 0;
        do {
          psVar8 = create_record((int)lVar7,(int)lVar12,(int)lVar12,(rtr_socket *)0x0);
          (spki_table->hashtable).bucket[lVar12] = (tommy_hashlin_node **)psVar8;
          _spki_table_add_assert(local_4028,psVar8);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x32);
        lVar7 = lVar7 + 1;
        spki_table = (spki_table *)(spki_table[1].hashtable.bucket + 4);
      } while (lVar7 != 0x32);
      iVar6 = spki_table_get_all(local_4028,*(uint32_t *)((long)in_stack_ffffffffffceebd8 + 0x14),
                                 (uint8_t *)in_stack_ffffffffffceebd8,local_1a8,
                                 (uint *)&stack0xffffffffffceebd0);
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, records[i][j]->asn, records[i][j]->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x159,"void test_ht_4(void)");
      }
      __assert_fail("result_len == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x15a,"void test_ht_4(void)");
    }
  }
  __assert_fail("count == 255",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0x97,"void test_ht_1(void)");
}

Assistant:

int main(void)
{
	test_ht_1();
	test_ht_2();
	test_ht_3();
	test_ht_4();
	test_ht_5();
	test_ht_6();
	test_ht_7();
	test_table_swap();
	test_table_diff();
	return EXIT_SUCCESS;
}